

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printProblemStats.cpp
# Opt level: O0

string * toEnotation_abi_cxx11_(LIndex nr)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  long lVar4;
  ulonglong in_RSI;
  string *in_RDI;
  stringstream ssE;
  stringstream ss;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  stringstream local_350 [16];
  ostream local_340 [376];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  ulonglong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::ostream::operator<<(local_188,local_10);
  std::__cxx11::stringstream::str();
  uVar1 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_1c8);
  if (uVar1 < 4) {
    std::__cxx11::stringstream::str();
  }
  else {
    std::__cxx11::stringstream::stringstream(local_350);
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::at((ulong)local_370);
    poVar3 = std::operator<<(local_340,*pcVar2);
    poVar3 = std::operator<<(poVar3,".");
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::at((ulong)local_390);
    std::operator<<(poVar3,*pcVar2);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::at((ulong)local_3b0);
    std::operator<<(local_340,*pcVar2);
    std::__cxx11::string::~string(local_3b0);
    poVar3 = std::operator<<(local_340,"e");
    std::__cxx11::stringstream::str();
    lVar4 = std::__cxx11::string::size();
    std::ostream::operator<<(poVar3,lVar4 - 1);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_350);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string toEnotation(LIndex nr)
{
    stringstream ss;
    ss << nr;
    if(ss.str().size()>3)
    {
        stringstream ssE;
        ssE << ss.str().at(0) << "." << ss.str().at(1);
        ssE << ss.str().at(2);
        ssE << "e" << ss.str().size()-1;
        return(ssE.str());
    } 
    else
        return(ss.str());
}